

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

void helicsFederateSetTimeProperty
               (HelicsFederate fed,int timeProperty,HelicsTime time,HelicsError *err)

{
  Federate *pFVar1;
  
  pFVar1 = getFed(fed,err);
  if (pFVar1 != (Federate *)0x0) {
    (*pFVar1->_vptr_Federate[3])(time,pFVar1,timeProperty);
  }
  return;
}

Assistant:

void helicsFederateSetTimeProperty(HelicsFederate fed, int timeProperty, HelicsTime time, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->setProperty(timeProperty, time);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}